

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsMotorSpeed.cpp
# Opt level: O2

void __thiscall
chrono::ChShaftsMotorSpeed::IntLoadConstraint_C
          (ChShaftsMotorSpeed *this,uint off_L,ChVectorDynamic<> *Qc,double c,bool do_clamp,
          double recovery_clamp)

{
  Scalar *pSVar1;
  undefined1 auVar2 [16];
  double dVar3;
  undefined1 in_register_00001248 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [16];
  
  auVar4._8_56_ = in_register_00001248;
  auVar4._0_8_ = recovery_clamp;
  dVar3 = 0.0;
  if (this->avoid_angle_drift == true) {
    (*(this->super_ChShaftsMotorBase).super_ChShaftsCouple.super_ChPhysicsItem.super_ChObj.
      _vptr_ChObj[0x40])();
    dVar3 = (dVar3 - this->aux_dt) - this->rot_offset;
  }
  dVar3 = dVar3 * c;
  if (do_clamp) {
    auVar2._8_8_ = 0x8000000000000000;
    auVar2._0_8_ = 0x8000000000000000;
    auVar2 = vxorpd_avx512vl(auVar4._0_16_,auVar2);
    auVar5._8_8_ = 0;
    auVar5._0_8_ = dVar3;
    auVar2 = vmaxsd_avx(auVar5,auVar2);
    auVar2 = vminsd_avx(auVar2,auVar4._0_16_);
    dVar3 = auVar2._0_8_;
  }
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)Qc,(ulong)off_L)
  ;
  *pSVar1 = dVar3 + *pSVar1;
  return;
}

Assistant:

void ChShaftsMotorSpeed::IntLoadConstraint_C(const unsigned int off_L,  // offset in Qc residual
                                        ChVectorDynamic<>& Qc,     // result: the Qc residual, Qc += c*C
                                        const double c,            // a scaling factor
                                        bool do_clamp,             // apply clamping to c*C?
                                        double recovery_clamp      // value for min/max clamping of c*C
                                        ) {
    // Add the time-dependent term in residual C as 
    //   C = d_error - d_setpoint - d_offset
    // with d_error = x_pos_A-x_pos_B, and d_setpoint = x(t)
    double C;
    if (this->avoid_angle_drift) 
        C = this->GetMotorRot()  - aux_dt - this->rot_offset; 
    else
        C = 0.0;

    double res = c * C;

    if (do_clamp) {
        res = ChMin(ChMax(res, -recovery_clamp), recovery_clamp);
    }
    Qc(off_L) += res;
}